

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void dumpRecursive(int level,QObject *object)

{
  QObjectData *pQVar1;
  long lVar2;
  QObject **ppQVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ushort *puVar6;
  long lVar7;
  long in_FS_OFFSET;
  QString local_80;
  QMessageLogger local_68;
  long *local_48 [2];
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (object != (QObject *)0x0) {
    local_68.context.version = 2;
    local_68.context._4_8_ = 0;
    local_68.context._12_8_ = 0;
    local_68.context.function._4_4_ = 0;
    local_68.context.category = "default";
    iVar4 = (**object->_vptr_QObject)(object);
    pcVar5 = QMetaObject::className((QMetaObject *)CONCAT44(extraout_var,iVar4));
    QObject::objectName(&local_80,object);
    puVar6 = QString::utf16(&local_80);
    (*((object->d_ptr).d)->_vptr_QObjectData[2])(local_48);
    QMessageLogger::debug
              (&local_68,"%*s%s::%ls %s",(ulong)(uint)(level * 4),"",pcVar5,puVar6,local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar1 = (object->d_ptr).d;
    lVar2 = (pQVar1->children).d.size;
    if (lVar2 != 0) {
      ppQVar3 = (pQVar1->children).d.ptr;
      lVar7 = 0;
      do {
        dumpRecursive(level + 1,*(QObject **)((long)ppQVar3 + lVar7));
        lVar7 = lVar7 + 8;
      } while (lVar2 << 3 != lVar7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dumpRecursive(int level, const QObject *object)
{
    if (object) {
        const int indent = level * 4;
        qDebug("%*s%s::%ls %s", indent, "", object->metaObject()->className(),
               qUtf16Printable(object->objectName()),
               QObjectPrivate::get(object)->flagsForDumping().c_str());
        for (auto child : object->children())
            dumpRecursive(level + 1, child);
    }
}